

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNABase::FMMix(OPNABase *this,Sample *buffer,int nsamples)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint local_20;
  int act;
  int nsamples_local;
  Sample *buffer_local;
  OPNABase *this_local;
  
  if (0 < (this->super_OPNBase).fmvolume) {
    if (((this->super_OPNBase).super_Timer.regtc & 0xc0) == 0) {
      Channel4::SetFNum((this->super_OPNBase).csmch,
                        this->fnum
                        [((long)(this->super_OPNBase).csmch - (long)&this->field_0x280) / 0x2e0]);
    }
    else {
      Operator::SetFNum(((this->super_OPNBase).csmch)->op,this->fnum3[1]);
      Operator::SetFNum(((this->super_OPNBase).csmch)->op + 1,this->fnum3[2]);
      Operator::SetFNum(((this->super_OPNBase).csmch)->op + 2,this->fnum3[0]);
      Operator::SetFNum(((this->super_OPNBase).csmch)->op + 3,this->fnum[2]);
    }
    iVar1 = Channel4::Prepare((Channel4 *)&this->field_0x840);
    uVar2 = Channel4::Prepare((Channel4 *)&this->field_0x560);
    local_20 = Channel4::Prepare((Channel4 *)&this->field_0x280);
    local_20 = (iVar1 << 2 | uVar2) << 2 | local_20;
    if ((this->reg29 & 0x80) != 0) {
      uVar2 = Channel4::Prepare((Channel4 *)&this->field_0xb20);
      uVar3 = Channel4::Prepare((Channel4 *)&this->field_0xe00);
      iVar1 = Channel4::Prepare((Channel4 *)&this->field_0x10e0);
      local_20 = (uVar2 | (uVar3 | iVar1 << 2) << 2) << 6 | local_20;
    }
    if ((this->reg22 & 8) == 0) {
      local_20 = local_20 & 0x555;
    }
    if ((local_20 & 0x555) != 0) {
      Mix6(this,buffer,nsamples,local_20);
    }
  }
  return;
}

Assistant:

void OPNABase::FMMix(Sample* buffer, int nsamples)
{
	if (fmvolume > 0)
	{
		// ����
		// Set F-Number
		if (!(regtc & 0xc0))
			csmch->SetFNum(fnum[csmch-ch]);
		else
		{
			// ���ʉ����[�h
			csmch->op[0].SetFNum(fnum3[1]);	csmch->op[1].SetFNum(fnum3[2]);
			csmch->op[2].SetFNum(fnum3[0]);	csmch->op[3].SetFNum(fnum[2]);
		}

		int act = (((ch[2].Prepare() << 2) | ch[1].Prepare()) << 2) | ch[0].Prepare();
		if (reg29 & 0x80)
			act |= (ch[3].Prepare() | ((ch[4].Prepare() | (ch[5].Prepare() << 2)) << 2)) << 6;
		if (!(reg22 & 0x08))
			act &= 0x555;

		if (act & 0x555)
		{
			Mix6(buffer, nsamples, act);
		}
	}
}